

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O1

bool __thiscall CECorrections::LoadTtUt1(CECorrections *this)

{
  bool bVar1;
  size_type sVar2;
  istream *piVar3;
  reference pvVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> *this_00;
  double delt;
  string url;
  string line;
  vector<double,_std::allocator<double>_> greg_vect;
  ifstream corrections_file;
  allocator<double> local_4d9;
  _func_int **local_4d8;
  vector<double,_std::allocator<double>_> *local_4d0;
  vector<double,_std::allocator<double>_> *local_4c8;
  double local_4c0;
  CECorrections *local_4b8;
  string local_4b0 [32];
  string local_490 [32];
  vector<double,_std::allocator<double>_> local_470;
  vector<double,_std::allocator<double>_> local_458;
  CECorrections local_440;
  CECorrections local_238;
  
  this_00 = &this->ttut1_mjd_;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4b0,"http://maia.usno.navy.mil/ser7/deltat.data",(allocator *)&local_238);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_238);
    LoadFile(&local_238,(string *)this,&this->ttut1_file_hist_);
    std::vector<double,_std::allocator<double>_>::reserve(this_00,5000);
    std::__cxx11::string::string(local_490);
    local_4c8 = &this->ttut1_delt_;
    local_4d0 = this_00;
    local_4b8 = this;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_238,local_490);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      local_440._vptr_CECorrections = (_func_int **)0x0;
      std::allocator<double>::allocator(&local_4d9);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_470,4,(value_type_conflict *)&local_440,&local_4d9);
      __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_4d9);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)local_490);
      local_4d8 = (_func_int **)std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_470,0);
      *pvVar4 = (value_type)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)local_490);
      local_4d8 = (_func_int **)std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_470,1);
      *pvVar4 = (value_type)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)local_490);
      local_4d8 = (_func_int **)std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_470,2);
      *pvVar4 = (value_type)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      std::vector<double,_std::allocator<double>_>::vector(&local_458,&local_470);
      local_4d8 = (_func_int **)CEDate::GregorianVect2MJD(&local_458);
      std::vector<double,_std::allocator<double>_>::~vector(&local_458);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)local_490);
      local_4c0 = std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      iVar5 = (int)(double)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      this_00 = local_4d0;
      local_440._vptr_CECorrections = (_func_int **)(double)iVar5;
      std::vector<double,_std::allocator<double>_>::push_back
                (local_4d0,(value_type_conflict *)&local_440);
      std::vector<double,_std::allocator<double>_>::push_back(local_4c8,&local_4c0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_470);
    }
    std::ifstream::close();
    std::__cxx11::string::operator=(local_4b0,"http://maia.usno.navy.mil/ser7/deltat.preds");
    LoadFile(&local_440,(string *)local_4b8,&local_4b8->ttut1_file_pred_);
    std::ifstream::operator=(&local_238,(ifstream *)&local_440);
    std::ifstream::~ifstream(&local_440);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&local_238,local_490);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_238,local_490);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::string::substr((ulong)&local_440,(ulong)local_490);
      iVar5 = std::__cxx11::stoi((string *)&local_440,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_440);
      local_4d8 = (_func_int **)(double)iVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::back(this_00);
      if (*pvVar4 <= (double)local_4d8 && (double)local_4d8 != *pvVar4) {
        std::__cxx11::string::substr((ulong)&local_440,(ulong)local_490);
        local_4c0 = std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&local_440);
        local_440._vptr_CECorrections = local_4d8;
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_00,(value_type_conflict *)&local_440);
        std::vector<double,_std::allocator<double>_>::push_back(local_4c8,&local_4c0);
      }
    }
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(this_00);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(local_4c8);
    std::__cxx11::string::~string(local_490);
    std::ifstream::~ifstream(&local_238);
    std::__cxx11::string::~string(local_4b0);
  }
  return true;
}

Assistant:

bool CECorrections::LoadTtUt1(void) const
{
    bool loaded = true;
    if (ttut1_mjd_.size() == 0) {

        try{
            // Check if the file has been stored
            std::string   url = "http://maia.usno.navy.mil/ser7/deltat.data";
            std::ifstream corrections_file = LoadFile(ttut1_file_hist_, url);    
        
            // Allocate an approximate amount of memory for the values
            ttut1_mjd_.reserve(5000);

            // Preliminary storage values
            int    mjd;
            double delt;

            // Loop through each line of the file
            std::string line;
            while(std::getline(corrections_file, line)) {

                // Extract the Gregorian vector date
                std::vector<double> greg_vect(4, 0.0);
                greg_vect[0] = std::stod(line.substr(1,4));
                greg_vect[1] = std::stod(line.substr(6,2));
                greg_vect[2] = std::stod(line.substr(9,2));
                mjd = CEDate::GregorianVect2MJD(greg_vect);

                // Try to load delta T from the file
                try {
                    delt = std::stod(line.substr(13,7));
                } 
                // Otherwise load from bulletin A positions
                catch (std::exception& e) {
                    // Reached end of useable fields in the file
                    break;
                }

                // Store the values into a vector
                ttut1_mjd_.push_back( mjd );
                ttut1_delt_.push_back( delt );
            }

            // Close the corrections file
            corrections_file.close();

            // Load the predicted corrections for the future
            url = "http://maia.usno.navy.mil/ser7/deltat.preds";
            corrections_file = LoadFile(ttut1_file_pred_, url);

            // Loop through each line of the file
            std::getline(corrections_file, line);   // First line is a header
            while(std::getline(corrections_file, line)) {

                // Extract the MJD
                mjd = std::stoi(line.substr(3,9));

                // Only add this value if it is actually from a later date
                // than the last entry in the vector
                if (mjd > ttut1_mjd_.back()) {

                    // Try to load delta T from the file
                    try {
                        delt = std::stod(line.substr(24,5));
                    } 
                    // Otherwise load from bulletin A positions
                    catch (std::exception& e) {
                        // Reached end of useable fields in the file
                        break;
                    }

                    // Store the values into a vector
                    ttut1_mjd_.push_back( mjd );
                    ttut1_delt_.push_back( delt );
                }
            }

            // Shrink up the vectors so we dont take more memory than necessary
            ttut1_mjd_.shrink_to_fit();
            ttut1_delt_.shrink_to_fit();

        } catch (std::exception& e) {
            std::cerr << "ERROR Unable to load corrections from file" << std::endl;
            std::cerr << e.what() << std::endl;
            loaded = false;
        }
    }
    return loaded;
}